

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game_server.c
# Opt level: O2

int deal_info(char *info,PIPE *pipes)

{
  int iVar1;
  int iVar2;
  long lVar3;
  size_t sVar4;
  ssize_t sVar5;
  int i;
  int *piVar6;
  long lVar7;
  bool bVar8;
  char para [8];
  char value [16];
  char n [16];
  char head [8];
  char dest [16];
  char val [8];
  char getall_info [128];
  
  __isoc99_sscanf(info,"%[^_]_%[^_]_%s",head,para,value);
  iVar1 = bcmp(head,"Game",5);
  if (iVar1 == 0) {
    if (para._0_4_ == 0x77656e) {
      iVar2 = atoi(value);
      memset(getall_info,0,0x1000);
      builtin_strncpy(getall_info,"info:",5);
      get_rand_char(getall_info,pipes[iVar2].level);
      write(pipes[iVar2].pipe[1],getall_info,0x100);
      iVar1 = 2;
      if (pipes[iVar2].index < 0x33) {
        iVar1 = pipes[iVar2].index + 1;
      }
      pipes[iVar2].index = iVar1;
    }
    else {
      iVar1 = bcmp(para,"update",7);
      if (iVar1 == 0) {
        __isoc99_sscanf(value,"%[^_]_%s",n,val);
        if (val._0_2_ == 0x73) {
          piVar6 = &pipes->index;
          lVar3 = 0x14;
LAB_001041c2:
          bVar8 = lVar3 != 0;
          lVar3 = lVar3 + -1;
          if (bVar8) {
            if (*(_Bool *)(piVar6 + -0x38) != true) goto LAB_001041eb;
            iVar1 = strcmp(n,(char *)((long)piVar6 + -0xdf));
            if (iVar1 != 0) goto LAB_001041eb;
            piVar6[(long)*piVar6 + -0x32] = piVar6[(long)*piVar6 + -0x32] + piVar6[-0x33] * 200;
            memcpy(getall_info,"update_",0x100);
            sprintf(dest,"%d",(ulong)(uint)piVar6[(long)*piVar6 + -0x32]);
            strcat(getall_info,(char *)((long)piVar6 + -0xdf));
            sVar4 = strlen(getall_info);
            (getall_info + sVar4)[0] = '_';
            (getall_info + sVar4)[1] = '\0';
            strcat(getall_info,dest);
            for (lVar3 = 8; lVar3 != 0x1278; lVar3 = lVar3 + 0xec) {
              if (*(char *)((long)pipes->pipe + lVar3) == '\x01') {
                iVar1 = *(int *)((long)pipes->pipe + lVar3 + -4);
                sVar4 = strlen(getall_info);
                sVar5 = write(iVar1,getall_info,sVar4);
                if (sVar5 == -1) {
                  puts("Pipe is broken!");
                }
              }
            }
          }
        }
      }
      else {
        iVar1 = bcmp(para,"chat",5);
        if (iVar1 == 0) {
          memset(getall_info,0,0x100);
          builtin_strncpy(getall_info,"chat_",5);
          strcat(getall_info,value);
          for (lVar3 = 8; lVar3 != 0x1278; lVar3 = lVar3 + 0xec) {
            if (*(char *)((long)pipes->pipe + lVar3) == '\x01') {
              iVar1 = *(int *)((long)pipes->pipe + lVar3 + -4);
              sVar4 = strlen(getall_info);
              sVar5 = write(iVar1,getall_info,sVar4);
              if (sVar5 == -1) {
                puts("Pipe is broken!");
              }
            }
          }
        }
        else if (para._0_4_ == 0x746567) {
          getall_info[8] = '\0';
          getall_info[9] = '\0';
          getall_info[10] = '\0';
          getall_info[0xb] = '\0';
          getall_info[0xc] = '\0';
          getall_info[0xd] = '\0';
          getall_info[0xe] = '\0';
          getall_info[0xf] = '\0';
          getall_info[0x70] = '\0';
          getall_info[0x71] = '\0';
          getall_info[0x72] = '\0';
          getall_info[0x73] = '\0';
          getall_info[0x74] = '\0';
          getall_info[0x75] = '\0';
          getall_info[0x76] = '\0';
          getall_info[0x77] = '\0';
          getall_info[0x78] = '\0';
          getall_info[0x79] = '\0';
          getall_info[0x7a] = '\0';
          getall_info[0x7b] = '\0';
          getall_info[0x7c] = '\0';
          getall_info[0x7d] = '\0';
          getall_info[0x7e] = '\0';
          getall_info[0x7f] = '\0';
          getall_info[0x60] = '\0';
          getall_info[0x61] = '\0';
          getall_info[0x62] = '\0';
          getall_info[99] = '\0';
          getall_info[100] = '\0';
          getall_info[0x65] = '\0';
          getall_info[0x66] = '\0';
          getall_info[0x67] = '\0';
          getall_info[0x68] = '\0';
          getall_info[0x69] = '\0';
          getall_info[0x6a] = '\0';
          getall_info[0x6b] = '\0';
          getall_info[0x6c] = '\0';
          getall_info[0x6d] = '\0';
          getall_info[0x6e] = '\0';
          getall_info[0x6f] = '\0';
          getall_info[0x50] = '\0';
          getall_info[0x51] = '\0';
          getall_info[0x52] = '\0';
          getall_info[0x53] = '\0';
          getall_info[0x54] = '\0';
          getall_info[0x55] = '\0';
          getall_info[0x56] = '\0';
          getall_info[0x57] = '\0';
          getall_info[0x58] = '\0';
          getall_info[0x59] = '\0';
          getall_info[0x5a] = '\0';
          getall_info[0x5b] = '\0';
          getall_info[0x5c] = '\0';
          getall_info[0x5d] = '\0';
          getall_info[0x5e] = '\0';
          getall_info[0x5f] = '\0';
          getall_info[0x40] = '\0';
          getall_info[0x41] = '\0';
          getall_info[0x42] = '\0';
          getall_info[0x43] = '\0';
          getall_info[0x44] = '\0';
          getall_info[0x45] = '\0';
          getall_info[0x46] = '\0';
          getall_info[0x47] = '\0';
          getall_info[0x48] = '\0';
          getall_info[0x49] = '\0';
          getall_info[0x4a] = '\0';
          getall_info[0x4b] = '\0';
          getall_info[0x4c] = '\0';
          getall_info[0x4d] = '\0';
          getall_info[0x4e] = '\0';
          getall_info[0x4f] = '\0';
          getall_info[0x30] = '\0';
          getall_info[0x31] = '\0';
          getall_info[0x32] = '\0';
          getall_info[0x33] = '\0';
          getall_info[0x34] = '\0';
          getall_info[0x35] = '\0';
          getall_info[0x36] = '\0';
          getall_info[0x37] = '\0';
          getall_info[0x38] = '\0';
          getall_info[0x39] = '\0';
          getall_info[0x3a] = '\0';
          getall_info[0x3b] = '\0';
          getall_info[0x3c] = '\0';
          getall_info[0x3d] = '\0';
          getall_info[0x3e] = '\0';
          getall_info[0x3f] = '\0';
          getall_info[0x20] = '\0';
          getall_info[0x21] = '\0';
          getall_info[0x22] = '\0';
          getall_info[0x23] = '\0';
          getall_info[0x24] = '\0';
          getall_info[0x25] = '\0';
          getall_info[0x26] = '\0';
          getall_info[0x27] = '\0';
          getall_info[0x28] = '\0';
          getall_info[0x29] = '\0';
          getall_info[0x2a] = '\0';
          getall_info[0x2b] = '\0';
          getall_info[0x2c] = '\0';
          getall_info[0x2d] = '\0';
          getall_info[0x2e] = '\0';
          getall_info[0x2f] = '\0';
          getall_info[0x10] = '\0';
          getall_info[0x11] = '\0';
          getall_info[0x12] = '\0';
          getall_info[0x13] = '\0';
          getall_info[0x14] = '\0';
          getall_info[0x15] = '\0';
          getall_info[0x16] = '\0';
          getall_info[0x17] = '\0';
          getall_info[0x18] = '\0';
          getall_info[0x19] = '\0';
          getall_info[0x1a] = '\0';
          getall_info[0x1b] = '\0';
          getall_info[0x1c] = '\0';
          getall_info[0x1d] = '\0';
          getall_info[0x1e] = '\0';
          getall_info[0x1f] = '\0';
          builtin_strncpy(getall_info,"get_",5);
          getall_info[5] = '\0';
          getall_info[6] = '\0';
          getall_info[7] = '\0';
          __isoc99_sscanf(value,"%[^_]%s",n,dest);
          for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
            iVar1 = strcmp(pipes[lVar3].name,n);
            if (iVar1 == 0) {
              for (lVar7 = 9; lVar7 != 0x1279; lVar7 = lVar7 + 0xec) {
                iVar1 = strcmp((char *)((long)pipes->pipe + lVar7),dest);
                if (iVar1 == 0) {
                  iVar1 = pipes[lVar3].pipe[1];
                  sVar4 = strlen(getall_info);
                  sVar5 = write(iVar1,getall_info,sVar4);
                  if (sVar5 != -1) break;
                  puts("Pipe is broken!");
                }
              }
            }
          }
        }
        else {
          iVar1 = bcmp(para,"getall",7);
          if (iVar1 != 0) {
            return 1;
          }
          for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
            iVar1 = strcmp(pipes[lVar3].name,value);
            if (iVar1 == 0) {
              lVar7 = 0x14;
              piVar6 = &pipes->index;
              while (bVar8 = lVar7 != 0, lVar7 = lVar7 + -1, bVar8) {
                getall_info[8] = '\0';
                getall_info[9] = '\0';
                getall_info[10] = '\0';
                getall_info[0xb] = '\0';
                getall_info[0xc] = '\0';
                getall_info[0xd] = '\0';
                getall_info[0xe] = '\0';
                getall_info[0xf] = '\0';
                getall_info[0x70] = '\0';
                getall_info[0x71] = '\0';
                getall_info[0x72] = '\0';
                getall_info[0x73] = '\0';
                getall_info[0x74] = '\0';
                getall_info[0x75] = '\0';
                getall_info[0x76] = '\0';
                getall_info[0x77] = '\0';
                getall_info[0x78] = '\0';
                getall_info[0x79] = '\0';
                getall_info[0x7a] = '\0';
                getall_info[0x7b] = '\0';
                getall_info[0x7c] = '\0';
                getall_info[0x7d] = '\0';
                getall_info[0x7e] = '\0';
                getall_info[0x7f] = '\0';
                getall_info[0x60] = '\0';
                getall_info[0x61] = '\0';
                getall_info[0x62] = '\0';
                getall_info[99] = '\0';
                getall_info[100] = '\0';
                getall_info[0x65] = '\0';
                getall_info[0x66] = '\0';
                getall_info[0x67] = '\0';
                getall_info[0x68] = '\0';
                getall_info[0x69] = '\0';
                getall_info[0x6a] = '\0';
                getall_info[0x6b] = '\0';
                getall_info[0x6c] = '\0';
                getall_info[0x6d] = '\0';
                getall_info[0x6e] = '\0';
                getall_info[0x6f] = '\0';
                getall_info[0x50] = '\0';
                getall_info[0x51] = '\0';
                getall_info[0x52] = '\0';
                getall_info[0x53] = '\0';
                getall_info[0x54] = '\0';
                getall_info[0x55] = '\0';
                getall_info[0x56] = '\0';
                getall_info[0x57] = '\0';
                getall_info[0x58] = '\0';
                getall_info[0x59] = '\0';
                getall_info[0x5a] = '\0';
                getall_info[0x5b] = '\0';
                getall_info[0x5c] = '\0';
                getall_info[0x5d] = '\0';
                getall_info[0x5e] = '\0';
                getall_info[0x5f] = '\0';
                getall_info[0x40] = '\0';
                getall_info[0x41] = '\0';
                getall_info[0x42] = '\0';
                getall_info[0x43] = '\0';
                getall_info[0x44] = '\0';
                getall_info[0x45] = '\0';
                getall_info[0x46] = '\0';
                getall_info[0x47] = '\0';
                getall_info[0x48] = '\0';
                getall_info[0x49] = '\0';
                getall_info[0x4a] = '\0';
                getall_info[0x4b] = '\0';
                getall_info[0x4c] = '\0';
                getall_info[0x4d] = '\0';
                getall_info[0x4e] = '\0';
                getall_info[0x4f] = '\0';
                getall_info[0x30] = '\0';
                getall_info[0x31] = '\0';
                getall_info[0x32] = '\0';
                getall_info[0x33] = '\0';
                getall_info[0x34] = '\0';
                getall_info[0x35] = '\0';
                getall_info[0x36] = '\0';
                getall_info[0x37] = '\0';
                getall_info[0x38] = '\0';
                getall_info[0x39] = '\0';
                getall_info[0x3a] = '\0';
                getall_info[0x3b] = '\0';
                getall_info[0x3c] = '\0';
                getall_info[0x3d] = '\0';
                getall_info[0x3e] = '\0';
                getall_info[0x3f] = '\0';
                getall_info[0x20] = '\0';
                getall_info[0x21] = '\0';
                getall_info[0x22] = '\0';
                getall_info[0x23] = '\0';
                getall_info[0x24] = '\0';
                getall_info[0x25] = '\0';
                getall_info[0x26] = '\0';
                getall_info[0x27] = '\0';
                getall_info[0x28] = '\0';
                getall_info[0x29] = '\0';
                getall_info[0x2a] = '\0';
                getall_info[0x2b] = '\0';
                getall_info[0x2c] = '\0';
                getall_info[0x2d] = '\0';
                getall_info[0x2e] = '\0';
                getall_info[0x2f] = '\0';
                getall_info[0x10] = '\0';
                getall_info[0x11] = '\0';
                getall_info[0x12] = '\0';
                getall_info[0x13] = '\0';
                getall_info[0x14] = '\0';
                getall_info[0x15] = '\0';
                getall_info[0x16] = '\0';
                getall_info[0x17] = '\0';
                getall_info[0x18] = '\0';
                getall_info[0x19] = '\0';
                getall_info[0x1a] = '\0';
                getall_info[0x1b] = '\0';
                getall_info[0x1c] = '\0';
                getall_info[0x1d] = '\0';
                getall_info[0x1e] = '\0';
                getall_info[0x1f] = '\0';
                builtin_strncpy(getall_info,"getall_",8);
                sVar4 = strlen(getall_info);
                (getall_info + sVar4)[0] = '_';
                (getall_info + sVar4)[1] = '\0';
                strcat(getall_info,(char *)((long)piVar6 + -0xdf));
                sVar4 = strlen(getall_info);
                (getall_info + sVar4)[0] = '_';
                (getall_info + sVar4)[1] = '\0';
                sprintf(n,"%d",(ulong)(uint)piVar6[(long)*piVar6 + -0x32]);
                iVar1 = pipes[lVar3].pipe[1];
                sVar4 = strlen(getall_info);
                sVar5 = write(iVar1,getall_info,sVar4);
                if (sVar5 == -1) {
                  puts("Pipe is broken!");
                }
                piVar6 = piVar6 + 0x3b;
              }
            }
          }
        }
      }
    }
    iVar1 = 1;
  }
  else {
    printf("Info head is wrong:%s!\n",head);
    iVar1 = -1;
  }
  return iVar1;
LAB_001041eb:
  piVar6 = piVar6 + 0x3b;
  goto LAB_001041c2;
}

Assistant:

int deal_info(char *info, struct PIPE *pipes){
    char head[8];
    char para[8];
    char value[16];
    int new_n = 0;
    sscanf(info, "%[^_]_%[^_]_%s", head, para, value);
    if(strcmp(head, "Game") != 0){
        printf("Info head is wrong:%s!\n", head);
        return -1;
    }
    if(strcmp(para, "new") == 0){
        new_n = atoi(value);
        char buf[MSG_MAX_SIZE]= "info:";
        get_rand_char(buf, pipes[new_n].level);
        write(pipes[new_n].pipe[1],buf, 256);
        if(pipes[new_n].index > MAX_SONG)
            pipes[new_n].index = 1;
        pipes[new_n].index++;
    } else if(strcmp(para, "update") == 0){
        char user[16];
        char val[8];
        sscanf(value, "%[^_]_%s", user, val);
        if(strcmp(val, "s") == 0){
            for(int i = 0; i < MAX_USER; i++){
                if(pipes[i].useState && strcmp(user, pipes[i].name) == 0){
                    pipes[i].score[pipes[i].index] += PER_SORCE * pipes[i].level;
                    char update_info[256] = "update_";
                    char b[16];
                    sprintf(b, "%d", pipes[i].score[pipes[i].index]);
                    strcat(update_info, pipes[i].name);
                    strcat(update_info, "_");
                    strcat(update_info, b);
                    for(int j = 0; j < MAX_USER; j++){
                        if(pipes[j].useState == true){
                            if(write(pipes[j].pipe[1], update_info, strlen(update_info)) == -1){
                                printf("Pipe is broken!\n");
                                continue;
                            }
                        }
                    }
                    break;
                }
            }

        }
    } else if(strcmp(para, "chat") == 0){
        char chat_info[256] = "chat_";
        strcat(chat_info, value);
        for(int j = 0; j < MAX_USER; j++){
            if(pipes[j].useState == true) {
                if (write(pipes[j].pipe[1], chat_info, strlen(chat_info)) == -1) {
                    printf("Pipe is broken!\n");
                    continue;
                }
            }
        }
    } else if(strcmp(para, "get") == 0){
        char get_info[128] = "get_";
        char src[16];
        char dest[16];
        sscanf(value, "%[^_]%s", src, dest);
        for(int i = 0; i < MAX_USER; i++){
            if(strcmp(pipes[i].name, src) == 0){
                for (int j = 0; j < MAX_USER ; ++j) {
                    if(strcmp(pipes[j].name, dest) == 0){
                        if(write(pipes[i].pipe[1], get_info, strlen(get_info)) == -1){
                            printf("Pipe is broken!\n");
                            continue;
                        }
                        break;
                    }
                }
            }
        }
    } else if(strcmp(para, "getall") == 0){
        char getall_info[128];
        char n[16];
        for(int i = 0; i < MAX_USER; i++) {
            if (strcmp(pipes[i].name, value) == 0) {
                for (int j = 0; j < MAX_USER ; ++j) {
                    memset(getall_info, 0, 128);
                    strcpy(getall_info, "getall_");
                    strcat(getall_info, "_");
                    strcat(getall_info, pipes[j].name);
                    strcat(getall_info, "_");
                    sprintf(n, "%d", pipes[j].score[pipes[j].index]);
                    if(write(pipes[i].pipe[1], getall_info, strlen(getall_info)) == -1){
                        printf("Pipe is broken!\n");
                        continue;
                    }
                }
            }
        }
    }
    return 1;
}